

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControlPrivate::createAutoBulletList(QWidgetTextControlPrivate *this)

{
  int iVar1;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QTextCursor::beginEditBlock();
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::blockFormat();
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextListFormat::QTextListFormat((QTextListFormat *)&local_48);
  QTextListFormat::setStyle((QTextListFormat *)&local_48,ListDisc);
  iVar1 = QTextBlockFormat::indent((QTextBlockFormat *)&local_38);
  QTextListFormat::setIndent((QTextListFormat *)&local_48,iVar1 + 1);
  QTextBlockFormat::setIndent((QTextBlockFormat *)&local_38,0);
  QTextCursor::setBlockFormat((QTextBlockFormat *)&this->cursor);
  QTextCursor::createList((QTextListFormat *)&this->cursor);
  QTextCursor::endEditBlock();
  QTextFormat::~QTextFormat((QTextFormat *)&local_48);
  QTextFormat::~QTextFormat((QTextFormat *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::createAutoBulletList()
{
    cursor.beginEditBlock();

    QTextBlockFormat blockFmt = cursor.blockFormat();

    QTextListFormat listFmt;
    listFmt.setStyle(QTextListFormat::ListDisc);
    listFmt.setIndent(blockFmt.indent() + 1);

    blockFmt.setIndent(0);
    cursor.setBlockFormat(blockFmt);

    cursor.createList(listFmt);

    cursor.endEditBlock();
}